

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int ssl_conf_set_psk_identity(mbedtls_ssl_config *conf,uchar *psk_identity,size_t psk_identity_len)

{
  uchar *puVar1;
  size_t psk_identity_len_local;
  uchar *psk_identity_local;
  mbedtls_ssl_config *conf_local;
  
  if ((((psk_identity == (uchar *)0x0) || (psk_identity_len == 0)) ||
      (psk_identity_len >> 0x10 != 0)) || (0x400 < psk_identity_len)) {
    conf_local._4_4_ = -0x7100;
  }
  else {
    puVar1 = (uchar *)calloc(1,psk_identity_len);
    conf->psk_identity = puVar1;
    if (conf->psk_identity == (uchar *)0x0) {
      conf_local._4_4_ = -0x7f00;
    }
    else {
      conf->psk_identity_len = psk_identity_len;
      memcpy(conf->psk_identity,psk_identity,conf->psk_identity_len);
      conf_local._4_4_ = 0;
    }
  }
  return conf_local._4_4_;
}

Assistant:

MBEDTLS_CHECK_RETURN_CRITICAL
static int ssl_conf_set_psk_identity(mbedtls_ssl_config *conf,
                                     unsigned char const *psk_identity,
                                     size_t psk_identity_len)
{
    /* Identity len will be encoded on two bytes */
    if (psk_identity               == NULL ||
        psk_identity_len           == 0    ||
        (psk_identity_len >> 16) != 0    ||
        psk_identity_len > MBEDTLS_SSL_OUT_CONTENT_LEN) {
        return MBEDTLS_ERR_SSL_BAD_INPUT_DATA;
    }

    conf->psk_identity = mbedtls_calloc(1, psk_identity_len);
    if (conf->psk_identity == NULL) {
        return MBEDTLS_ERR_SSL_ALLOC_FAILED;
    }

    conf->psk_identity_len = psk_identity_len;
    memcpy(conf->psk_identity, psk_identity, conf->psk_identity_len);

    return 0;
}